

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O2

bool __thiscall Game::OnUserUpdate(Game *this,float fElapsedTime)

{
  int64_t *internetPoints;
  StatusBar *this_00;
  SpeechBubble *pSVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  element_type *peVar5;
  bool bVar6;
  HWButton HVar7;
  result_type rVar8;
  int iVar9;
  int32_t iVar10;
  int32_t iVar11;
  Pixel col;
  anon_union_4_2_12391da5_for_Pixel_0 col_00;
  vi2d *pvVar12;
  Decal *pDVar13;
  Sprite *pSVar14;
  Renderable *pRVar15;
  float fVar16;
  allocator<char> local_2f2;
  allocator<char> local_2f1;
  string local_2f0;
  vf2d local_2d0;
  float local_2c8;
  undefined1 local_2b0 [24];
  undefined1 local_298 [16];
  vf2d local_288;
  __shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2> local_280;
  __shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2> local_270;
  __shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2> local_260;
  __shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2> local_250;
  undefined1 local_240 [240];
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  vi2d local_50;
  vi2d local_48;
  vi2d local_40;
  vi2d local_38;
  
  local_2c8 = fElapsedTime;
  switch(this->state) {
  case MENU:
    pvVar12 = olc::PixelGameEngine::GetMousePos(&this->super_PixelGameEngine);
    iVar9 = pvVar12->x;
    iVar4 = pvVar12->y;
    iVar10 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
    if ((((iVar10 / 2 + -0x32 <= iVar9) &&
         (iVar10 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine),
         iVar9 <= iVar10 / 2 + 0x32)) &&
        (iVar10 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine),
        iVar10 / 2 + -10 <= iVar4)) &&
       (((iVar10 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine),
         iVar4 <= iVar10 / 2 + 10 &&
         (HVar7 = olc::PixelGameEngine::GetMouse(&this->super_PixelGameEngine,0),
         ((uint3)HVar7 & 1) != 0)) && (this->started == false)))) {
      this->started = true;
    }
    fVar16 = this->menuFadeTimer;
    if (this->started == true) {
      fVar16 = fVar16 + local_2c8;
      this->menuFadeTimer = fVar16;
    }
    if (2.0 <= fVar16) {
      this->state = FIRST_PHASE;
    }
    iVar10 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_240,"The Great\n   MMO  \n Machine ",&local_2f1);
    olc::PixelGameEngine::GetTextSize((PixelGameEngine *)local_2b0,(string *)this);
    local_2d0.x = (float)(iVar10 / 2) - (float)(int)local_2b0._0_8_;
    local_2d0.y = 40.0 - (float)SUB84(local_2b0._0_8_,4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f0,"The Great\n   MMO  \n Machine ",&local_2f2);
    local_288.x = 2.0;
    local_288.y = 2.0;
    olc::PixelGameEngine::DrawStringDecal
              (&this->super_PixelGameEngine,&local_2d0,&local_2f0,(Pixel)olc::BLUE.field_1,
               &local_288);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)local_240);
    iVar10 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
    iVar11 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
    local_240._0_4_ = (float)(iVar10 / 2) + -50.0;
    local_240._4_4_ = (float)(iVar11 / 2) + -10.0;
    local_2f0._M_dataplus._M_p = (pointer)0x41a0000042c80000;
    olc::PixelGameEngine::FillRectDecal
              (&this->super_PixelGameEngine,(vf2d *)local_240,(vf2d *)&local_2f0,
               (Pixel)olc::WHITE.field_1);
    iVar10 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
    iVar11 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_240,"Play",&local_2f1);
    olc::PixelGameEngine::GetTextSize((PixelGameEngine *)local_2b0,(string *)this);
    local_2d0.x = (float)(iVar10 / 2) - (float)((int)local_2b0._0_8_ / 2);
    local_2d0.y = (float)(iVar11 / 2) - (float)(SUB84(local_2b0._0_8_,4) / 2);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"Play",&local_2f2);
    local_288.x = 1.0;
    local_288.y = 1.0;
    olc::PixelGameEngine::DrawStringDecal
              (&this->super_PixelGameEngine,&local_2d0,&local_2f0,(Pixel)olc::BLUE.field_1,
               &local_288);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)local_240);
    local_240._0_4_ = 0.0;
    local_240._4_4_ = 0.0;
    iVar10 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
    iVar11 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
    local_2f0._M_dataplus._M_p = (pointer)CONCAT44((float)iVar11,(float)iVar10);
    col_00.field_1 =
         (anon_struct_4_4_d83cdc77_for_anon_union_4_2_12391da5_for_Pixel_0_1)
         olc::PixelF(0.0,0.0,0.0,this->menuFadeTimer * 0.5);
    goto LAB_001149ac;
  case FIRST_PHASE:
    switch(this->cutsceneState) {
    case 0:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"Hmm, I really need a new\nvideo idea...",
                 (allocator<char> *)&local_2f0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"res/sounds/hmm.wav",(allocator<char> *)&local_2d0);
      iVar10 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
      local_298._12_4_ = iVar10 + -0x40;
      local_298._8_4_ = 0x46;
      iVar10 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
      local_38.x = iVar10 + -0x4c;
      local_38.y = 0x40;
      std::__shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_250,
                 &(this->speechBubbleSprite).
                  super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>);
      SpeechBubble::SpeechBubble
                ((SpeechBubble *)local_240,&local_70,&local_90,(vi2d *)(local_298 + 8),&local_38,
                 (shared_ptr<olc::Renderable> *)&local_250);
      SpeechBubble::operator=(&this->currentSpeechBubble,(SpeechBubble *)local_240);
      SpeechBubble::~SpeechBubble((SpeechBubble *)local_240);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_250._M_refcount);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      SpeechBubble::play(&this->currentSpeechBubble,&this->soloud);
      this->cutsceneState = 1;
      break;
    case 1:
      pSVar1 = &this->currentSpeechBubble;
      fVar16 = SpeechBubble::getTimePastEnd(pSVar1);
      if (3.0 <= fVar16) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,"I know, I\'m gonna make an mmo",
                   (allocator<char> *)&local_2f0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,"res/sounds/iknow.wav",(allocator<char> *)&local_2d0);
        iVar10 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        local_298._4_4_ = iVar10 + -0x40;
        local_298._0_4_ = 0x46;
        iVar10 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
        local_40.x = iVar10 + -0x4c;
        local_40.y = 0x40;
        std::__shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_260,
                   &(this->speechBubbleSprite).
                    super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>);
        SpeechBubble::SpeechBubble
                  ((SpeechBubble *)local_240,&local_b0,&local_d0,(vi2d *)local_298,&local_40,
                   (shared_ptr<olc::Renderable> *)&local_260);
        SpeechBubble::operator=(pSVar1,(SpeechBubble *)local_240);
        SpeechBubble::~SpeechBubble((SpeechBubble *)local_240);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_260._M_refcount);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_b0);
        SpeechBubble::play(pSVar1,&this->soloud);
        this->cutsceneState = 2;
      }
      break;
    case 2:
      fVar16 = SpeechBubble::getTimePastEnd(&this->currentSpeechBubble);
      if (3.0 <= fVar16) {
        this->cutsceneState = 3;
      }
      break;
    case 3:
      HVar7 = olc::PixelGameEngine::GetKey(&this->super_PixelGameEngine,A);
      if (((uint3)HVar7 & 1) != 0) {
        this->aPressed = true;
      }
      HVar7 = olc::PixelGameEngine::GetKey(&this->super_PixelGameEngine,D);
      if ((((uint3)HVar7 & 1) != 0) && (this->aPressed == true)) {
        StatusBar::addWork(&this->statusBar);
        this->aPressed = false;
        this->pressCounter = this->pressCounter + 1;
      }
      if (this->pressCounter == 0x1e) {
        this->cutsceneState = 4;
      }
      break;
    case 4:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"Eugh, this is going slowly",(allocator<char> *)&local_2f0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,"res/sounds/eughh.wav",(allocator<char> *)&local_2d0);
      iVar10 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
      local_2b0._20_4_ = iVar10 + -0x40;
      local_2b0._16_4_ = 0x46;
      iVar10 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
      local_48.x = iVar10 + -0x4c;
      local_48.y = 0x40;
      std::__shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_270,
                 &(this->speechBubbleSprite).
                  super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>);
      SpeechBubble::SpeechBubble
                ((SpeechBubble *)local_240,&local_f0,&local_110,(vi2d *)(local_2b0 + 0x10),&local_48
                 ,(shared_ptr<olc::Renderable> *)&local_270);
      SpeechBubble::operator=(&this->currentSpeechBubble,(SpeechBubble *)local_240);
      SpeechBubble::~SpeechBubble((SpeechBubble *)local_240);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_270._M_refcount);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_f0);
      SpeechBubble::play(&this->currentSpeechBubble,&this->soloud);
      this->cutsceneState = 5;
      break;
    case 5:
      pSVar1 = &this->currentSpeechBubble;
      fVar16 = SpeechBubble::getTimePastEnd(pSVar1);
      if (3.0 <= fVar16) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,
                   "I know, I\'m gonna make an mmo\nmaking machine, there\'s no\nway that goes wrong"
                   ,(allocator<char> *)&local_2f0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_150,"res/sounds/mmo.wav",(allocator<char> *)&local_2d0);
        iVar10 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        local_2b0._12_4_ = iVar10 + -0x40;
        local_2b0._8_4_ = 0x46;
        iVar10 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
        local_50.x = iVar10 + -0x4c;
        local_50.y = 0x40;
        std::__shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_280,
                   &(this->speechBubbleSprite).
                    super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>);
        SpeechBubble::SpeechBubble
                  ((SpeechBubble *)local_240,&local_130,&local_150,(vi2d *)(local_2b0 + 8),&local_50
                   ,(shared_ptr<olc::Renderable> *)&local_280);
        SpeechBubble::operator=(pSVar1,(SpeechBubble *)local_240);
        SpeechBubble::~SpeechBubble((SpeechBubble *)local_240);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_280._M_refcount);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_130);
        SpeechBubble::play(pSVar1,&this->soloud);
        this->cutsceneState = 6;
      }
      break;
    case 6:
      fVar16 = SpeechBubble::getTimePastEnd(&this->currentSpeechBubble);
      if (3.0 <= fVar16) {
        this->cutsceneState = 7;
      }
      break;
    case 7:
      fVar16 = this->fadeoutTimer + fElapsedTime;
      this->fadeoutTimer = fVar16;
      if (4.0 <= fVar16) {
        this->state = MACHINE;
      }
    }
    SpeechBubble::tick(&this->currentSpeechBubble,local_2c8);
    iVar10 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
    local_240._0_8_ = (ulong)(uint)((float)iVar10 + -64.0) << 0x20;
    pDVar13 = olc::Renderable::operator_cast_to_Decal_(&this->javidBaseSprite);
    local_2f0._M_dataplus._M_p = (pointer)0x4000000040000000;
    olc::PixelGameEngine::DrawDecal
              (&this->super_PixelGameEngine,(vf2d *)local_240,pDVar13,(vf2d *)&local_2f0,
               (Pixel *)&olc::WHITE.field_1);
    if (this->cutsceneState == 3) {
      pRVar15 = &this->aButtonSprite;
      if (this->aPressed == true) {
        iVar10 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
        pSVar14 = olc::Renderable::Sprite(pRVar15);
        iVar9 = pSVar14->width;
        iVar11 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        pSVar14 = olc::Renderable::Sprite(pRVar15);
        local_240._0_4_ = (undefined4)((iVar10 / 2 - iVar9) + -0x28);
        local_240._4_4_ = (undefined4)(pSVar14->height / -2 + iVar11 / 2);
        pDVar13 = olc::Renderable::operator_cast_to_Decal_(&this->aButtonPressedSprite);
        local_2f0._M_dataplus._M_p = (pointer)0x3f8000003f800000;
        olc::PixelGameEngine::DrawDecal
                  (&this->super_PixelGameEngine,(vf2d *)local_240,pDVar13,(vf2d *)&local_2f0,
                   (Pixel *)&olc::WHITE.field_1);
        iVar10 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
        local_2c8 = (float)(iVar10 / 2 + 0x28);
        iVar10 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        pSVar14 = olc::Renderable::Sprite(&this->dButtonSprite);
        local_240._4_4_ = (float)(pSVar14->height / -2 + iVar10 / 2);
        local_240._0_4_ = local_2c8;
        pDVar13 = olc::Renderable::operator_cast_to_Decal_(&this->dButtonSprite);
        local_2f0._M_dataplus._M_p = (pointer)0x3f8000003f800000;
        olc::PixelGameEngine::DrawDecal
                  (&this->super_PixelGameEngine,(vf2d *)local_240,pDVar13,(vf2d *)&local_2f0,
                   (Pixel *)&olc::WHITE.field_1);
        iVar10 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        local_240._0_8_ = (ulong)(uint)((float)iVar10 + -64.0) << 0x20;
        pDVar13 = olc::Renderable::operator_cast_to_Decal_(&this->javidRArmDownSprite);
        local_2f0._M_dataplus._M_p = (pointer)0x4000000040000000;
        olc::PixelGameEngine::DrawDecal
                  (&this->super_PixelGameEngine,(vf2d *)local_240,pDVar13,(vf2d *)&local_2f0,
                   (Pixel *)&olc::WHITE.field_1);
        iVar9 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        pRVar15 = &this->javidLArmUpSprite;
      }
      else {
        iVar10 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
        pSVar14 = olc::Renderable::Sprite(pRVar15);
        iVar9 = pSVar14->width;
        iVar11 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        pSVar14 = olc::Renderable::Sprite(pRVar15);
        local_240._0_4_ = (undefined4)((iVar10 / 2 - iVar9) + -0x28);
        local_240._4_4_ = (undefined4)(pSVar14->height / -2 + iVar11 / 2);
        pDVar13 = olc::Renderable::operator_cast_to_Decal_(pRVar15);
        local_2f0._M_dataplus._M_p = (pointer)0x3f8000003f800000;
        olc::PixelGameEngine::DrawDecal
                  (&this->super_PixelGameEngine,(vf2d *)local_240,pDVar13,(vf2d *)&local_2f0,
                   (Pixel *)&olc::WHITE.field_1);
        iVar10 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
        local_2c8 = (float)(iVar10 / 2 + 0x28);
        iVar10 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        pSVar14 = olc::Renderable::Sprite(&this->dButtonSprite);
        local_240._4_4_ = (float)(pSVar14->height / -2 + iVar10 / 2);
        local_240._0_4_ = local_2c8;
        pDVar13 = olc::Renderable::operator_cast_to_Decal_(&this->dButtonPressedSprite);
        local_2f0._M_dataplus._M_p = (pointer)0x3f8000003f800000;
        olc::PixelGameEngine::DrawDecal
                  (&this->super_PixelGameEngine,(vf2d *)local_240,pDVar13,(vf2d *)&local_2f0,
                   (Pixel *)&olc::WHITE.field_1);
        iVar10 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        local_240._0_8_ = (ulong)(uint)((float)iVar10 + -64.0) << 0x20;
        pDVar13 = olc::Renderable::operator_cast_to_Decal_(&this->javidRArmUpSprite);
        local_2f0._M_dataplus._M_p = (pointer)0x4000000040000000;
        olc::PixelGameEngine::DrawDecal
                  (&this->super_PixelGameEngine,(vf2d *)local_240,pDVar13,(vf2d *)&local_2f0,
                   (Pixel *)&olc::WHITE.field_1);
        iVar9 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        pRVar15 = &this->javidLArmDownSprite;
      }
      local_240._0_8_ = (ulong)(uint)((float)iVar9 + -64.0) << 0x20;
      pDVar13 = olc::Renderable::operator_cast_to_Decal_(pRVar15);
      local_2f0._M_dataplus._M_p = (pointer)0x4000000040000000;
      olc::PixelGameEngine::DrawDecal
                (&this->super_PixelGameEngine,(vf2d *)local_240,pDVar13,(vf2d *)&local_2f0,
                 (Pixel *)&olc::WHITE.field_1);
    }
    else {
      iVar10 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
      local_240._0_8_ = (ulong)(uint)((float)iVar10 + -64.0) << 0x20;
      pDVar13 = olc::Renderable::operator_cast_to_Decal_(&this->javidRArmDownSprite);
      local_2f0._M_dataplus._M_p = (pointer)0x4000000040000000;
      olc::PixelGameEngine::DrawDecal
                (&this->super_PixelGameEngine,(vf2d *)local_240,pDVar13,(vf2d *)&local_2f0,
                 (Pixel *)&olc::WHITE.field_1);
      iVar10 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
      local_240._0_8_ = (ulong)(uint)((float)iVar10 + -64.0) << 0x20;
      pDVar13 = olc::Renderable::operator_cast_to_Decal_(&this->javidLArmDownSprite);
      local_2f0._M_dataplus._M_p = (pointer)0x4000000040000000;
      olc::PixelGameEngine::DrawDecal
                (&this->super_PixelGameEngine,(vf2d *)local_240,pDVar13,(vf2d *)&local_2f0,
                 (Pixel *)&olc::WHITE.field_1);
      SpeechBubble::drawSelf(&this->currentSpeechBubble,&this->super_PixelGameEngine);
    }
    StatusBar::drawSelf(&this->statusBar,&this->super_PixelGameEngine);
    local_2c8 = this->fadeoutTimer;
    if (3.0 <= local_2c8) {
      local_2c8 = 3.0;
    }
    local_2c8 = local_2c8 / 3.0;
    local_240._0_4_ = 0.0;
    local_240._4_4_ = 0.0;
    iVar10 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
    iVar11 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
    local_2f0._M_dataplus._M_p = (pointer)CONCAT44((float)iVar11,(float)iVar10);
    col_00.field_1 =
         (anon_struct_4_4_d83cdc77_for_anon_union_4_2_12391da5_for_Pixel_0_1)
         olc::PixelF(0.0,0.0,0.0,local_2c8);
LAB_001149ac:
    olc::PixelGameEngine::FillRectDecal
              (&this->super_PixelGameEngine,(vf2d *)local_240,(vf2d *)&local_2f0,
               (Pixel)col_00.field_1);
    break;
  case MACHINE:
    fVar16 = this->minigameTimer - fElapsedTime;
    this->minigameTimer = fVar16;
    if (fVar16 <= 0.0) {
      this->minigameTimer = 10.0;
      do {
        rVar8 = std::uniform_int_distribution<int>::operator()(&this->minigameDistrib,&this->engine)
        ;
      } while (rVar8 == this->curMinigameId);
      std::__shared_ptr<Minigame,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->currentMinigame).super___shared_ptr<Minigame,_(__gnu_cxx::_Lock_policy)2>,
                 &(this->minigames).
                  super__Vector_base<std::shared_ptr<Minigame>,_std::allocator<std::shared_ptr<Minigame>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[rVar8].
                  super___shared_ptr<Minigame,_(__gnu_cxx::_Lock_policy)2>);
      this->curMinigameId = rVar8;
      (**((this->currentMinigame).super___shared_ptr<Minigame,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         _vptr_Minigame)();
    }
    uVar2 = this->armSwitchTimer;
    uVar3 = this->headBobTimer;
    this->armSwitchTimer = local_2c8 + (float)uVar2;
    this->headBobTimer = local_2c8 + (float)uVar3;
    peVar5 = (this->currentMinigame).super___shared_ptr<Minigame,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    internetPoints = &this->internetPoints;
    (*peVar5->_vptr_Minigame[1])(peVar5,this,internetPoints);
    if (this->internetPoints < 0) {
      *internetPoints = 0;
    }
    bVar6 = SkillTree::tick(&this->skillTree,&this->super_PixelGameEngine,internetPoints);
    if (bVar6) {
      this->armSwitchPeriod = this->armSwitchPeriod * 0.7;
    }
    this_00 = &this->statusBar;
    StatusBar::tick(this_00,&this->super_PixelGameEngine);
    if (this->headBobTimer <= this->headBobPeriod * 0.5) {
      iVar9 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
      pRVar15 = &this->robotBaseSprite0;
    }
    else {
      iVar9 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
      pRVar15 = &this->robotBaseSprite1;
    }
    local_240._0_8_ = (ulong)(uint)((float)iVar9 + -64.0) << 0x20;
    pDVar13 = olc::Renderable::operator_cast_to_Decal_(pRVar15);
    local_2f0._M_dataplus._M_p = (pointer)0x4000000040000000;
    olc::PixelGameEngine::DrawDecal
              (&this->super_PixelGameEngine,(vf2d *)local_240,pDVar13,(vf2d *)&local_2f0,
               (Pixel *)&olc::WHITE.field_1);
    if (this->headBobPeriod <= this->headBobTimer) {
      this->headBobTimer = this->headBobTimer - this->headBobPeriod;
    }
    if (0.016 <= this->armSwitchPeriod) {
      if (this->armSwitchTimer <= this->armSwitchPeriod * 0.5) {
        iVar10 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        local_240._0_8_ = (ulong)(uint)((float)iVar10 + -64.0) << 0x20;
        pDVar13 = olc::Renderable::operator_cast_to_Decal_(&this->robotRArmDownSprite);
        local_2f0._M_dataplus._M_p = (pointer)0x4000000040000000;
        olc::PixelGameEngine::DrawDecal
                  (&this->super_PixelGameEngine,(vf2d *)local_240,pDVar13,(vf2d *)&local_2f0,
                   (Pixel *)&olc::WHITE.field_1);
        iVar9 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        pRVar15 = &this->robotLArmUpSprite;
      }
      else {
        iVar10 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        local_240._0_8_ = (ulong)(uint)((float)iVar10 + -64.0) << 0x20;
        pDVar13 = olc::Renderable::operator_cast_to_Decal_(&this->robotRArmUpSprite);
        local_2f0._M_dataplus._M_p = (pointer)0x4000000040000000;
        olc::PixelGameEngine::DrawDecal
                  (&this->super_PixelGameEngine,(vf2d *)local_240,pDVar13,(vf2d *)&local_2f0,
                   (Pixel *)&olc::WHITE.field_1);
        iVar9 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        pRVar15 = &this->robotLArmDownSprite;
      }
      local_240._0_8_ = (ulong)(uint)((float)iVar9 + -64.0) << 0x20;
      pDVar13 = olc::Renderable::operator_cast_to_Decal_(pRVar15);
    }
    else {
      iVar10 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
      local_240._0_8_ = (ulong)(uint)((float)iVar10 + -64.0) << 0x20;
      iVar9 = rand();
      pDVar13 = olc::Renderable::operator_cast_to_Decal_
                          ((this->fastHandSprites).
                           super__Vector_base<olc::Renderable,_std::allocator<olc::Renderable>_>.
                           _M_impl.super__Vector_impl_data._M_start + iVar9 % 3);
    }
    local_2f0._M_dataplus._M_p = (pointer)0x4000000040000000;
    olc::PixelGameEngine::DrawDecal
              (&this->super_PixelGameEngine,(vf2d *)local_240,pDVar13,(vf2d *)&local_2f0,
               (Pixel *)&olc::WHITE.field_1);
    while( true ) {
      if (this->armSwitchTimer < this->armSwitchPeriod) break;
      this->armSwitchTimer = this->armSwitchTimer - this->armSwitchPeriod;
      StatusBar::addWork(this_00);
    }
    peVar5 = (this->currentMinigame).super___shared_ptr<Minigame,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    (*peVar5->_vptr_Minigame[2])(peVar5,this);
    local_240._0_4_ = 0.0;
    local_240._4_4_ = 5.0;
    pDVar13 = olc::Renderable::operator_cast_to_Decal_(&this->ipSprite);
    local_2f0._M_dataplus._M_p = (pointer)0x3f8000003f800000;
    olc::PixelGameEngine::DrawDecal
              (&this->super_PixelGameEngine,(vf2d *)local_240,pDVar13,(vf2d *)&local_2f0,
               (Pixel *)&olc::WHITE.field_1);
    local_2f0._M_dataplus._M_p = (pointer)0x4110000041800000;
    std::__cxx11::to_string((string *)local_240,this->internetPoints);
    local_2d0.x = 1.0;
    local_2d0.y = 1.0;
    olc::PixelGameEngine::DrawStringDecal
              (&this->super_PixelGameEngine,(vf2d *)&local_2f0,(string *)local_240,
               (Pixel)olc::WHITE.field_1,&local_2d0);
    std::__cxx11::string::~string((string *)local_240);
    SkillTree::drawSelf(&this->skillTree,&this->super_PixelGameEngine,internetPoints);
    StatusBar::drawSelf(this_00,&this->super_PixelGameEngine);
    bVar6 = StatusBar::done(this_00);
    if (bVar6) {
      this->winFadeTimer = local_2c8 + this->winFadeTimer;
    }
    local_240._0_4_ = 0.0;
    local_240._4_4_ = 0.0;
    iVar10 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
    iVar11 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
    local_2f0._M_dataplus._M_p = (pointer)CONCAT44((float)iVar11,(float)iVar10);
    col = olc::PixelF(0.0,0.0,0.0,this->winFadeTimer * 0.5);
    olc::PixelGameEngine::FillRectDecal
              (&this->super_PixelGameEngine,(vf2d *)local_240,(vf2d *)&local_2f0,col);
    if (2.0 <= this->winFadeTimer) {
      this->state = WIN;
    }
    break;
  case WIN:
    local_240._0_4_ = 0.0;
    local_240._4_4_ = 0.0;
    pDVar13 = olc::Renderable::operator_cast_to_Decal_(&this->background);
    local_2f0._M_dataplus._M_p = (pointer)0x3f8000003f800000;
    olc::PixelGameEngine::DrawDecal
              (&this->super_PixelGameEngine,(vf2d *)local_240,pDVar13,(vf2d *)&local_2f0,
               (Pixel *)&olc::WHITE.field_1);
  }
  return true;
}

Assistant:

bool Game::OnUserUpdate(float fElapsedTime) {
    switch(state) {
	case CurrentState::MENU:
	    {
		const auto mousePos = GetMousePos();
		if (mousePos.x >= ScreenWidth() / 2 - 50 && mousePos.x <= ScreenWidth() / 2 + 50 &&
			mousePos.y >= ScreenHeight() / 2 - 10 && mousePos.y <= ScreenHeight() / 2 + 10 &&
			GetMouse(0).bPressed &&
			!started) {
		    started = true;
		}
		if (started) {
		    menuFadeTimer += fElapsedTime;
		}
		if (menuFadeTimer >= 2.0f) {
		    state = CurrentState::FIRST_PHASE;
		}
		DrawStringDecal(
			olc::vf2d{float(ScreenWidth() / 2), 40.0f} -
			GetTextSize("The Great\n   MMO  \n Machine "),
			"The Great\n   MMO  \n Machine ",
			olc::BLUE,
			{2.0f, 2.0f});
		FillRectDecal(
			{ScreenWidth() / 2 - 50.0f, ScreenHeight() / 2 - 10.0f},
			{100.0f, 20.0f},
			olc::WHITE);
		DrawStringDecal(
			olc::vf2d{float(ScreenWidth() / 2), float(ScreenHeight() / 2)} -
			GetTextSize("Play") / 2,
			"Play",
			olc::BLUE);
		FillRectDecal({0.0f, 0.0f},
			{float(ScreenWidth()), float(ScreenHeight())},
			olc::PixelF(0.0f, 0.0f, 0.0f, menuFadeTimer / 2));
		break;
	    }
	case CurrentState::FIRST_PHASE:
	    {
		//Update
		switch (cutsceneState) {
		    case 0:
			currentSpeechBubble = SpeechBubble{
			    "Hmm, I really need a new\nvideo idea...",
			    "res/sounds/hmm.wav",
			    {70, ScreenHeight() - 64},
			    {ScreenWidth() - 76, 64},
			    speechBubbleSprite
			};
			currentSpeechBubble.play(soloud);
			cutsceneState = 1;
			break;
		    case 1:
			if (currentSpeechBubble.getTimePastEnd() >= 3) {
			    currentSpeechBubble = SpeechBubble{
				"I know, I'm gonna make an mmo",
				"res/sounds/iknow.wav",
				{70, ScreenHeight() - 64},
				{ScreenWidth() - 76, 64},
				speechBubbleSprite
			    };
			    currentSpeechBubble.play(soloud);
			    cutsceneState = 2;
			}
			break;
		    case 2:
			if (currentSpeechBubble.getTimePastEnd() >= 3) {
			    cutsceneState = 3;
			}
			break;
		    case 3:
			if (GetKey(olc::A).bPressed) {
			    aPressed = true;
			}
			if (GetKey(olc::D).bPressed && aPressed) {
			    statusBar.addWork();
			    aPressed = false;
			    pressCounter++;
			}
			if (pressCounter == 30) {
			    cutsceneState = 4;
			}
			break;
		    case 4:
			currentSpeechBubble = SpeechBubble{
			    "Eugh, this is going slowly",
			    "res/sounds/eughh.wav",
			    {70, ScreenHeight() - 64},
			    {ScreenWidth() - 76, 64},
			    speechBubbleSprite
			};
			currentSpeechBubble.play(soloud);
			cutsceneState = 5;
			break;
		    case 5:
			if (currentSpeechBubble.getTimePastEnd() >= 3) {
			    currentSpeechBubble = SpeechBubble{
				"I know, I'm gonna make an mmo\nmaking machine, there's no\nway that goes wrong",
				"res/sounds/mmo.wav",
				{70, ScreenHeight() - 64},
				{ScreenWidth() - 76, 64},
				speechBubbleSprite
			    };
			    currentSpeechBubble.play(soloud);
			    cutsceneState = 6;
			}
			break;
		    case 6:
			if (currentSpeechBubble.getTimePastEnd() >= 3) {
			    cutsceneState = 7;
			}
			break;
		    case 7:
			fadeoutTimer += fElapsedTime;
			if (fadeoutTimer >= 4.0f) {
			    state = CurrentState::MACHINE;
			}
			break;
		}
		currentSpeechBubble.tick(fElapsedTime);

		//Draw
		DrawDecal({0, ScreenHeight() - 64.0f}, javidBaseSprite, {2, 2});

		if (cutsceneState == 3) {
		    if (aPressed) {
			DrawDecal({float(ScreenWidth() / 2 - 40 - aButtonSprite.Sprite()->width),
				float(ScreenHeight() / 2 - aButtonSprite.Sprite()->height / 2)},
				aButtonPressedSprite);
			DrawDecal({float(ScreenWidth() / 2 + 40),
				float(ScreenHeight() / 2 - dButtonSprite.Sprite()->height / 2)},
				dButtonSprite);
			DrawDecal({0, ScreenHeight() - 64.0f}, javidRArmDownSprite, {2, 2});
			DrawDecal({0, ScreenHeight() - 64.0f}, javidLArmUpSprite, {2, 2});
		    } else {
			DrawDecal({float(ScreenWidth() / 2 - 40 - aButtonSprite.Sprite()->width),
				float(ScreenHeight() / 2 - aButtonSprite.Sprite()->height / 2)},
				aButtonSprite);
			DrawDecal({float(ScreenWidth() / 2 + 40),
				float(ScreenHeight() / 2 - dButtonSprite.Sprite()->height / 2)},
				dButtonPressedSprite);
			DrawDecal({0, ScreenHeight() - 64.0f}, javidRArmUpSprite, {2, 2});
			DrawDecal({0, ScreenHeight() - 64.0f}, javidLArmDownSprite, {2, 2});
		    }
		} else {
		    DrawDecal({0, ScreenHeight() - 64.0f}, javidRArmDownSprite, {2, 2});
		    DrawDecal({0, ScreenHeight() - 64.0f}, javidLArmDownSprite, {2, 2});
		    currentSpeechBubble.drawSelf(this);
		}

		statusBar.drawSelf(this);

		float fadeoutColor = std::min(3.0f, fadeoutTimer) / 3.0f;

		FillRectDecal({0.0f, 0.0f},
			{float(ScreenWidth()), float(ScreenHeight())},
			olc::PixelF(0.0f, 0.0f, 0.0f, fadeoutColor));

		break;
	    }
	case CurrentState::MACHINE:
	    {
		//Update
		minigameTimer -= fElapsedTime;
		if (minigameTimer <= 0.0f) {
		    minigameTimer = 10.0f;
		    int nextMinigame = minigameDistrib(engine);
		    while (nextMinigame == curMinigameId) {
			nextMinigame = minigameDistrib(engine);
		    }
		    currentMinigame = minigames[nextMinigame];
		    curMinigameId = nextMinigame;
		    currentMinigame->start();
		}
		armSwitchTimer += fElapsedTime;
		headBobTimer += fElapsedTime;
		currentMinigame->tick(this, internetPoints);
		if (internetPoints < 0) {
		    internetPoints = 0;
		}
		if (skillTree.tick(this, internetPoints)) {
		    armSwitchPeriod *= 0.7f;
		}
		statusBar.tick(this);
		//Draw
		if (headBobTimer <= headBobPeriod / 2) {
		    DrawDecal({0, ScreenHeight() - 64.0f}, robotBaseSprite0, {2, 2});
		} else {
		    DrawDecal({0, ScreenHeight() - 64.0f}, robotBaseSprite1, {2, 2});
		}
		if (headBobTimer >= headBobPeriod) {
		    headBobTimer -= headBobPeriod;
		}

		if (armSwitchPeriod >= 0.016) {
		    if (armSwitchTimer <= armSwitchPeriod / 2) {
			DrawDecal({0, ScreenHeight() - 64.0f}, robotRArmDownSprite, {2, 2});
			DrawDecal({0, ScreenHeight() - 64.0f}, robotLArmUpSprite, {2, 2});
		    } else {
			DrawDecal({0, ScreenHeight() - 64.0f}, robotRArmUpSprite, {2, 2});
			DrawDecal({0, ScreenHeight() - 64.0f}, robotLArmDownSprite, {2, 2});
		    }
		} else {
		    DrawDecal({0, ScreenHeight() - 64.0f}, fastHandSprites[rand() % 3], {2, 2});
		}
		while (armSwitchTimer >= armSwitchPeriod) {
		    armSwitchTimer -= armSwitchPeriod;
		    statusBar.addWork();
		}

		currentMinigame->drawSelf(this);

		DrawDecal({0, 5}, ipSprite);
		DrawStringDecal({16, 9}, std::to_string(internetPoints));
		
		skillTree.drawSelf(this, internetPoints);
		statusBar.drawSelf(this);

		if (statusBar.done()) {
		    winFadeTimer += fElapsedTime;
		}

		FillRectDecal({0, 0},
			{float(ScreenWidth()), float(ScreenHeight())},
			olc::PixelF(0, 0, 0, winFadeTimer / 2));

		if (winFadeTimer >= 2.0f) {
		    state = CurrentState::WIN;
		}
		break;
	    }
	case CurrentState::WIN:
	    {
		DrawDecal({0, 0}, background);
		break;
	    }
    }
    return true;
}